

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_checksum.cpp
# Opt level: O0

uint crnlib::adler32(void *pBuf,size_t buflen,uint adler32)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  unsigned_long i;
  size_t blocklen;
  unsigned_long s2;
  unsigned_long s1;
  unsigned_long ADLER_MOD;
  uint8 *buffer;
  uint adler32_local;
  size_t buflen_local;
  void *pBuf_local;
  
  s1 = (unsigned_long)(adler32 & 0xffff);
  s2 = (unsigned_long)(adler32 >> 0x10);
  blocklen = buflen % 0x15b0;
  buffer = (uint8 *)pBuf;
  buflen_local = buflen;
  while (buflen_local != 0) {
    for (i = 0; i + 7 < blocklen; i = i + 8) {
      lVar1 = *buffer + s1;
      lVar2 = (ulong)buffer[1] + lVar1;
      lVar3 = (ulong)buffer[2] + lVar2;
      lVar4 = (ulong)buffer[3] + lVar3;
      lVar5 = (ulong)buffer[4] + lVar4;
      lVar6 = (ulong)buffer[5] + lVar5;
      lVar7 = (ulong)buffer[6] + lVar6;
      s1 = (ulong)buffer[7] + lVar7;
      s2 = s1 + lVar7 + lVar6 + lVar5 + lVar4 + lVar3 + lVar2 + lVar1 + s2;
      buffer = buffer + 8;
    }
    for (; i < blocklen; i = i + 1) {
      s1 = *buffer + s1;
      s2 = s1 + s2;
      buffer = buffer + 1;
    }
    s1 = s1 % 0xfff1;
    s2 = s2 % 0xfff1;
    buflen_local = buflen_local - blocklen;
    blocklen = 0x15b0;
  }
  return (int)(s2 << 0x10) + (int)s1;
}

Assistant:

uint adler32(const void* pBuf, size_t buflen, uint adler32) {
  const uint8* buffer = static_cast<const uint8*>(pBuf);

  const unsigned long ADLER_MOD = 65521;
  unsigned long s1 = adler32 & 0xffff, s2 = adler32 >> 16;
  size_t blocklen;
  unsigned long i;

  blocklen = buflen % 5552;
  while (buflen) {
    for (i = 0; i + 7 < blocklen; i += 8) {
      s1 += buffer[0], s2 += s1;
      s1 += buffer[1], s2 += s1;
      s1 += buffer[2], s2 += s1;
      s1 += buffer[3], s2 += s1;
      s1 += buffer[4], s2 += s1;
      s1 += buffer[5], s2 += s1;
      s1 += buffer[6], s2 += s1;
      s1 += buffer[7], s2 += s1;

      buffer += 8;
    }

    for (; i < blocklen; ++i)
      s1 += *buffer++, s2 += s1;

    s1 %= ADLER_MOD, s2 %= ADLER_MOD;
    buflen -= blocklen;
    blocklen = 5552;
  }
  return (s2 << 16) + s1;
}